

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O0

void __thiscall gulcalc::outputcoveragedata(gulcalc *this,int event_id)

{
  undefined8 uVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  const_reference pvVar5;
  ulong uStack_38;
  OASIS_FLOAT tiv;
  size_t i;
  gulcoverageSampleslevel gc;
  size_t j;
  int event_id_local;
  gulcalc *this_local;
  
  if (((this->opt_).coverageLevelOutput & 1U) != 0) {
    gc.sidx = 1;
    gc.loss = 0.0;
    for (; uVar1 = gc._8_8_,
        sVar2 = std::
                vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ::size(&this->cov_), (ulong)uVar1 < sVar2; gc._8_8_ = gc._8_8_ + 1) {
      pvVar3 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](&this->cov_,gc._8_8_);
      sVar2 = std::vector<float,_std::allocator<float>_>::size(pvVar3);
      if (sVar2 != 0) {
        i._4_4_ = gc.sidx;
        uStack_38 = 1;
        i._0_4_ = event_id;
        while( true ) {
          pvVar3 = std::
                   vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ::operator[](&this->cov_,gc._8_8_);
          sVar2 = std::vector<float,_std::allocator<float>_>::size(pvVar3);
          if (sVar2 <= uStack_38) break;
          gc.event_id = (int)uStack_38 + -2;
          pvVar3 = std::
                   vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ::operator[](&this->cov_,gc._8_8_);
          pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](pvVar3,uStack_38);
          gc.coverage_id = (int)*pvVar4;
          pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                             (this->coverages_,(long)i._4_4_);
          if (*pvVar5 < (float)gc.coverage_id) {
            gc.coverage_id = (int)*pvVar5;
          }
          if (gc.event_id != 0) {
            if (gc.event_id == -1) {
              covoutputgul(this,(gulcoverageSampleslevel *)&i);
            }
            else if (this->loss_threshold_ <= (double)(float)gc.coverage_id) {
              covoutputgul(this,(gulcoverageSampleslevel *)&i);
            }
          }
          uStack_38 = uStack_38 + 1;
        }
      }
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::clear(&this->cov_);
    sVar2 = std::vector<float,_std::allocator<float>_>::size(this->coverages_);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(&this->cov_,sVar2);
  }
  return;
}

Assistant:

void gulcalc::outputcoveragedata(int event_id)
{
	if (opt_.coverageLevelOutput == false) return;
	for (size_t j = 1; j < cov_.size(); j++) {
		if (cov_[j].size() > 0) {
			gulcoverageSampleslevel gc;
			gc.event_id = event_id;
			gc.coverage_id = j;
			for (size_t i = 1; i < cov_[j].size(); i++) {
				gc.sidx = i - 2;
				gc.loss = cov_[j][i];
				OASIS_FLOAT tiv = (*coverages_)[gc.coverage_id];
				if (gc.loss > tiv) gc.loss = tiv;
				if (gc.sidx) {
					if (gc.sidx == -1) {
						covoutputgul(gc);		// always output the mean	
					}
					else {
						if (gc.loss >= loss_threshold_) {
							covoutputgul(gc);
						}
					}
				}
			}

		}
	}
	cov_.clear();
	cov_.resize(coverages_->size());
}